

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::numeric> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>::
alloc<int>(allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>
           *this,int *args)

{
  size_t sVar1;
  holder<cs::numeric> *phVar2;
  
  if ((this->mOffset == 0) || (global_thread_counter != 0)) {
    phVar2 = (holder<cs::numeric> *)operator_new(0x30);
  }
  else {
    sVar1 = this->mOffset;
    this->mOffset = sVar1 - 1;
    phVar2 = this->mPool[sVar1 - 1];
  }
  (phVar2->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_0023ad38;
  (phVar2->mDat).type = true;
  *(long *)&(phVar2->mDat).data = (long)*args;
  return phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}